

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite_sinusoidal_modeling_to_autocorrelation.cc
# Opt level: O3

bool __thiscall
sptk::CompositeSinusoidalModelingToAutocorrelation::Run
          (CompositeSinusoidalModelingToAutocorrelation *this,
          vector<double,_std::allocator<double>_> *composite_sinusoidal_modeling,
          vector<double,_std::allocator<double>_> *autocorrelation)

{
  uint uVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  size_type __new_size;
  pointer pdVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  pointer local_48;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar5 = false;
  if (autocorrelation != (vector<double,_std::allocator<double>_> *)0x0) {
    uVar3 = this->num_sine_wave_;
    uVar1 = uVar3 * 2;
    pdVar9 = (composite_sinusoidal_modeling->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)(composite_sinusoidal_modeling->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar9;
    __new_size = lVar7 >> 3;
    bVar5 = false;
    if (__new_size == (long)(int)uVar1) {
      local_48 = (autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      uVar4 = uVar3;
      if ((long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)local_48 != lVar7) {
        std::vector<double,_std::allocator<double>_>::resize(autocorrelation,__new_size);
        pdVar9 = (composite_sinusoidal_modeling->super__Vector_base<double,_std::allocator<double>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar4 = this->num_sine_wave_;
        local_48 = (autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
      }
      uVar6 = (ulong)uVar4;
      if (0 < (int)uVar3) {
        uVar10 = 1;
        if (1 < (int)uVar1) {
          uVar10 = (ulong)uVar1;
        }
        uVar8 = 0;
        do {
          if ((int)uVar6 < 1) {
            dVar11 = 0.0;
          }
          else {
            dVar11 = 0.0;
            lVar7 = 0;
            do {
              dVar2 = pdVar9[(int)uVar4 + lVar7];
              dVar12 = cos(pdVar9[lVar7] * (double)(int)uVar8);
              dVar11 = dVar11 + dVar12 * dVar2;
              lVar7 = lVar7 + 1;
              uVar6 = (ulong)this->num_sine_wave_;
            } while (lVar7 < (long)uVar6);
          }
          local_48[uVar8] = dVar11;
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar10);
      }
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool CompositeSinusoidalModelingToAutocorrelation::Run(
    const std::vector<double>& composite_sinusoidal_modeling,
    std::vector<double>* autocorrelation) const {
  // Check inputs.
  const int length(num_sine_wave_ * 2);
  if (!is_valid_ ||
      composite_sinusoidal_modeling.size() !=
          static_cast<std::size_t>(length) ||
      NULL == autocorrelation) {
    return false;
  }

  // Prepare memories.
  if (autocorrelation->size() != static_cast<std::size_t>(length)) {
    autocorrelation->resize(length);
  }

  const double* frequencies(&(composite_sinusoidal_modeling[0]));
  const double* intensities(&(composite_sinusoidal_modeling[num_sine_wave_]));
  double* v(&((*autocorrelation)[0]));

  // Calculate autocorrelation using Eq. (2).
  for (int l(0); l < length; ++l) {
    double sum(0.0);
    for (int i(0); i < num_sine_wave_; ++i) {
      sum += intensities[i] * std::cos(l * frequencies[i]);
    }
    v[l] = sum;
  }

  return true;
}